

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCache.c
# Opt level: O0

void cuddCacheInsert(DdManager *table,ptruint op,DdNode *f,DdNode *g,DdNode *h,DdNode *data)

{
  uint uVar1;
  DdCache *pDVar2;
  ptruint uhc;
  ptruint ugc;
  ptruint ufc;
  ptruint uh;
  ptruint ug;
  ptruint uf;
  DdCache *entry;
  uint hash;
  int posn;
  DdNode *data_local;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  ptruint op_local;
  DdManager *table_local;
  
  uVar1 = ((((uint)(*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1) | (uint)f & 1 |
            (uint)op & 0xe) +
           ((uint)(*(long *)(((ulong)h & 0xfffffffffffffffe) + 0x20) << 1) | (uint)h & 1)) *
           0xc00005 +
          ((uint)(*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1) | (uint)g & 1 |
          (uint)(op >> 4))) * 0x40f1f9;
  pDVar2 = table->cache + (int)(uVar1 >> ((byte)table->cacheShift & 0x1f));
  table->cachecollisions = (double)(pDVar2->data != (DdNode *)0x0) + table->cachecollisions;
  table->cacheinserts = table->cacheinserts + 1.0;
  pDVar2->f = (DdNode *)((ulong)f | op & 0xe);
  pDVar2->g = (DdNode *)((ulong)g | op >> 4);
  pDVar2->h = (ptruint)h;
  pDVar2->data = data;
  pDVar2->hash = uVar1;
  return;
}

Assistant:

void
cuddCacheInsert(
  DdManager * table,
  ptruint op,
  DdNode * f,
  DdNode * g,
  DdNode * h,
  DdNode * data)
{
    int posn;
    unsigned hash;
    register DdCache *entry;
    ptruint uf, ug, uh;
    ptruint ufc, ugc, uhc;

    uf = (ptruint) f | (op & 0xe);
    ug = (ptruint) g | (op >> 4);
    uh = (ptruint) h;

    ufc = (ptruint) cuddF2L(f) | (op & 0xe);
    ugc = (ptruint) cuddF2L(g) | (op >> 4);
    uhc = (ptruint) cuddF2L(h);

    hash = ddCHash2_(uhc,ufc,ugc);
//    posn = ddCHash2(uhc,ufc,ugc,table->cacheShift);
    posn = hash >> table->cacheShift;
    entry = &table->cache[posn];

    table->cachecollisions += entry->data != NULL;
    table->cacheinserts++;

    entry->f    = (DdNode *) uf;
    entry->g    = (DdNode *) ug;
    entry->h    = uh;
    entry->data = data;
#ifdef DD_CACHE_PROFILE
    entry->count++;
#endif
    entry->hash = hash;

}